

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char-test.c++
# Opt level: O3

void __thiscall kj::parse::anon_unknown_0::TestCase376::run(TestCase376 *this)

{
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 *params_2;
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  Bits64 *pBVar4;
  Sequence_<kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>
  *pSVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Maybe<kj::String> result;
  Input input;
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>,_kj::parse::_::ArrayToString>
  parser;
  Maybe<kj::String> local_b0;
  IteratorInput<char,_const_char_*> local_90;
  AddFailureAdapter local_70;
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>,_kj::parse::_::ArrayToString>
  local_58;
  
  pBVar4 = &DAT_0043d188;
  pSVar5 = (Sequence_<kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>
            *)&local_58;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pSVar5->first).subParser.first.bits[0] = *pBVar4;
    pBVar4 = pBVar4 + 1;
    pSVar5 = &((Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_____>_>
                *)&pSVar5->first)->rest;
  }
  local_90.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_90.pos = "\'hello\'";
  local_90.end = "";
  local_90.best = "\'hello\'";
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&local_b0,&local_58,&local_90);
  params_2 = &local_b0.ptr.field_1;
  if (local_b0.ptr.isSet == true) {
    if (((local_b0.ptr.field_1.value.content.size_ != 6) ||
        ((char)*(int *)(local_b0.ptr.field_1.value.content.ptr + 4) != 'o' ||
         *(int *)local_b0.ptr.field_1.value.content.ptr != 0x6c6c6568)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[39],char_const(&)[6],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x180,ERROR,
                 "\"failed: expected \" \"(\\\"hello\\\") == (*value)\", \"hello\", *value",
                 (char (*) [39])"failed: expected (\"hello\") == (*value)",(char (*) [6])0x3790ba,
                 &params_2->value);
    }
  }
  else {
    local_70.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
    ;
    local_70.line = 0x182;
    local_70.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[28]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x182,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [28])"Expected \"hello\", got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_70);
  }
  if ((local_90.pos != local_90.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x184,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if ((local_b0.ptr.isSet == true) &&
     (uVar1 = local_b0.ptr.field_1.value.content.ptr,
     local_b0.ptr.field_1.value.content.ptr != (char *)0x0)) {
    uVar2 = local_b0.ptr.field_1.value.content.size_;
    local_b0.ptr.field_1._0_16_ = (undefined1  [16])0x0;
    (**(local_b0.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
              (local_b0.ptr.field_1.value.content.disposer,uVar1,1,uVar2,uVar2,0);
  }
  if (local_90.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_90.best < local_90.pos) {
      local_90.best = local_90.pos;
    }
    if (local_90.best <= (local_90.parent)->best) {
      local_90.best = (local_90.parent)->best;
    }
    (local_90.parent)->best = local_90.best;
  }
  local_90.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_90.pos = "\'test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\x01\x02\x1cn\'";
  local_90.end = "";
  local_90.best = "\'test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\x01\x02\x1cn\'";
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&local_b0,&local_58,&local_90);
  if (local_b0.ptr.isSet == true) {
    if (local_b0.ptr.field_1.value.content.size_ == 0x13) {
      auVar6[0] = -(*local_b0.ptr.field_1.value.content.ptr == 't');
      auVar6[1] = -(local_b0.ptr.field_1.value.content.ptr[1] == 'e');
      auVar6[2] = -(local_b0.ptr.field_1.value.content.ptr[2] == 's');
      auVar6[3] = -(local_b0.ptr.field_1.value.content.ptr[3] == 't');
      auVar6[4] = -(local_b0.ptr.field_1.value.content.ptr[4] == '\a');
      auVar6[5] = -(local_b0.ptr.field_1.value.content.ptr[5] == '\b');
      auVar6[6] = -(local_b0.ptr.field_1.value.content.ptr[6] == '\f');
      auVar6[7] = -(local_b0.ptr.field_1.value.content.ptr[7] == '\n');
      auVar6[8] = -(local_b0.ptr.field_1.value.content.ptr[8] == '\r');
      auVar6[9] = -(local_b0.ptr.field_1.value.content.ptr[9] == '\t');
      auVar6[10] = -(local_b0.ptr.field_1.value.content.ptr[10] == '\v');
      auVar6[0xb] = -(local_b0.ptr.field_1.value.content.ptr[0xb] == '\'');
      auVar6[0xc] = -(local_b0.ptr.field_1.value.content.ptr[0xc] == '\"');
      auVar6[0xd] = -(local_b0.ptr.field_1.value.content.ptr[0xd] == '?');
      auVar6[0xe] = -(local_b0.ptr.field_1.value.content.ptr[0xe] == '\x01');
      auVar6[0xf] = -(local_b0.ptr.field_1.value.content.ptr[0xf] == '\x02');
      auVar7[0] = -((char)*(undefined2 *)(local_b0.ptr.field_1.value.content.ptr + 0x10) == '\x1c');
      auVar7[1] = -((char)((ushort)*(undefined2 *)(local_b0.ptr.field_1.value.content.ptr + 0x10) >>
                          8) == 'n');
      auVar7[2] = 0xff;
      auVar7[3] = 0xff;
      auVar7[4] = 0xff;
      auVar7[5] = 0xff;
      auVar7[6] = 0xff;
      auVar7[7] = 0xff;
      auVar7[8] = 0xff;
      auVar7[9] = 0xff;
      auVar7[10] = 0xff;
      auVar7[0xb] = 0xff;
      auVar7[0xc] = 0xff;
      auVar7[0xd] = 0xff;
      auVar7[0xe] = 0xff;
      auVar7[0xf] = 0xff;
      auVar7 = auVar7 & auVar6;
      if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) goto LAB_0025689d;
    }
    if (kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[71],char_const(&)[19],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x18c,ERROR,
                 "\"failed: expected \" \"(\\\"test\\\\a\\\\b\\\\f\\\\n\\\\r\\\\t\\\\v\\\\\'\\\\\\\"\\\\?\\\\x01\\\\2\\\\34\\\\156\\\") == (*value)\", \"test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\\x01\\2\\34\\156\", *value"
                 ,(char (*) [71])
                  "failed: expected (\"test\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\?\\x01\\2\\34\\156\") == (*value)"
                 ,(char (*) [19])"test\a\b\f\n\r\t\v\'\"?\x01\x02\x1cn",&params_2->value);
    }
  }
  else {
    local_70.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
    ;
    local_70.line = 0x18e;
    local_70.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x18e,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [27])"Expected string, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_70);
  }
LAB_0025689d:
  if ((local_90.pos != local_90.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,400,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if ((local_b0.ptr.isSet == true) &&
     (uVar1 = local_b0.ptr.field_1.value.content.ptr,
     local_b0.ptr.field_1.value.content.ptr != (char *)0x0)) {
    uVar2 = local_b0.ptr.field_1.value.content.size_;
    local_b0.ptr.field_1._0_16_ = (undefined1  [16])0x0;
    (**(local_b0.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
              (local_b0.ptr.field_1.value.content.disposer,uVar1,1,uVar2,uVar2,0);
  }
  if (local_90.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_90.best < local_90.pos) {
      local_90.best = local_90.pos;
    }
    if (local_90.best <= (local_90.parent)->best) {
      local_90.best = (local_90.parent)->best;
    }
    (local_90.parent)->best = local_90.best;
  }
  local_90.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_90.pos = "\'foo\"bar\'";
  local_90.end = "";
  local_90.best = "\'foo\"bar\'";
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\''>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'\\'>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'x'>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,_'\''>_>,_kj::parse::_::ArrayToString>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>(&local_b0,&local_58,&local_90);
  if (local_b0.ptr.isSet == true) {
    if (((local_b0.ptr.field_1.value.content.size_ != 8) ||
        (*(int *)(local_b0.ptr.field_1.value.content.ptr + 3) != 0x72616222 ||
         *(int *)local_b0.ptr.field_1.value.content.ptr != 0x226f6f66)) &&
       (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[42],char_const(&)[8],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x198,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\\\\\"bar\\\") == (*value)\", \"foo\\\"bar\", *value"
                 ,(char (*) [42])"failed: expected (\"foo\\\"bar\") == (*value)",
                 (char (*) [8])"foo\"bar",&params_2->value);
    }
  }
  else {
    local_70.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
    ;
    local_70.line = 0x19a;
    local_70.handled = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x19a,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [27])"Expected string, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_70);
  }
  if ((local_90.pos != local_90.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x19c,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  if ((local_b0.ptr.isSet == true) &&
     (uVar1 = local_b0.ptr.field_1.value.content.ptr,
     local_b0.ptr.field_1.value.content.ptr != (char *)0x0)) {
    uVar2 = local_b0.ptr.field_1.value.content.size_;
    local_b0.ptr.field_1._0_16_ = (undefined1  [16])0x0;
    (**(local_b0.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
              (local_b0.ptr.field_1.value.content.disposer,uVar1,1,uVar2,uVar2,0);
  }
  if (local_90.parent != (IteratorInput<char,_const_char_*> *)0x0) {
    if (local_90.best < local_90.pos) {
      local_90.best = local_90.pos;
    }
    if (local_90.best <= (local_90.parent)->best) {
      local_90.best = (local_90.parent)->best;
    }
    (local_90.parent)->best = local_90.best;
  }
  return;
}

Assistant:

TEST(CharParsers, SingleQuotedString) {
  constexpr auto parser = singleQuotedString;

  {
    StringPtr text = "\'hello\'";
    Input input(text.begin(), text.end());
    Maybe<String> result = parser(input);
    KJ_IF_MAYBE(value, result) {
      EXPECT_EQ("hello", *value);
    } else {
      ADD_FAILURE() << "Expected \"hello\", got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }